

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReply.hpp
# Opt level: O1

string * HttpReply::ExtractCookie(string *__return_storage_ptr__,string *reply,char *cookie)

{
  long lVar1;
  ulong uVar2;
  
  strlen(cookie);
  lVar1 = std::__cxx11::string::find((char *)reply,(ulong)cookie,0);
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find((char)reply,0x3d);
    uVar2 = std::__cxx11::string::find_first_of((char *)reply,0x125332,lVar1 + 1U);
    if (uVar2 != 0xffffffffffffffff && lVar1 + 1U < uVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)reply);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

static std::string ExtractCookie(const std::string& reply, const char* cookie) {
        size_t valueStart = reply.find(cookie);
        if (valueStart == std::string::npos) return "";
        valueStart = reply.find('=', valueStart) + 1;
        size_t valueEnd = reply.find_first_of(";\r", valueStart);
        if (valueEnd == std::string::npos || valueEnd <= valueStart) return "";
        return reply.substr(valueStart, valueEnd - valueStart);
    }